

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

void jp2_cdef_dumpdata(jp2_box_t *box,FILE *out)

{
  uint local_24;
  uint i;
  jp2_cdef_t *cdef;
  FILE *out_local;
  jp2_box_t *box_local;
  
  for (local_24 = 0; (ulong)local_24 < (box->data).ftyp.majver; local_24 = local_24 + 1) {
    fprintf((FILE *)out,"channo=%lu; type=%lu; assoc=%lu\n",
            *(undefined8 *)((box->data).bpcc.bpcs + (ulong)local_24 * 0x18),
            *(undefined8 *)((box->data).bpcc.bpcs + (ulong)local_24 * 0x18 + 8),
            *(undefined8 *)((box->data).bpcc.bpcs + (ulong)local_24 * 0x18 + 0x10));
  }
  return;
}

Assistant:

static void jp2_cdef_dumpdata(jp2_box_t *box, FILE *out)
{
	jp2_cdef_t *cdef = &box->data.cdef;
	unsigned int i;
	for (i = 0; i < cdef->numchans; ++i) {
		fprintf(out,
		  "channo=%"PRIuFAST16"; type=%"PRIuFAST16"; assoc=%"PRIuFAST16"\n",
		  cdef->ents[i].channo, cdef->ents[i].type, cdef->ents[i].assoc);
	}
}